

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool P_LookForTID(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  int i;
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  byte local_59;
  TFlags<ActorFlag3,_unsigned_int> local_58;
  TFlags<ActorFlag2,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  int local_4c;
  undefined1 local_48 [4];
  int c;
  FActorIterator iterator;
  bool chasegoal;
  bool reachedend;
  AActor *other;
  FLookExParams *params_local;
  INTBOOL allaround_local;
  AActor *actor_local;
  
  iterator._15_1_ = 0;
  if (params == (FLookExParams *)0x0) {
    local_59 = 1;
  }
  else {
    local_59 = (params->flags & 4U) != 0 ^ 0xff;
  }
  iterator._14_1_ = local_59 & 1;
  pAVar3 = P_BlockmapSearch(actor,0,LookForTIDInBlock,params);
  if (pAVar3 != (AActor *)0x0) {
    pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->goal);
    if (pAVar4 != (AActor *)0x0) {
      pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->goal);
      bVar1 = TObjPtr<AActor>::operator==(&actor->target,pAVar4);
      if (bVar1) {
        actor->reactiontime = 0;
      }
    }
    TObjPtr<AActor>::operator=(&actor->target,pAVar3);
    TObjPtr<AActor>::operator=(&actor->LastLookActor,pAVar3);
    return true;
  }
  bVar1 = TObjPtr<AActor>::operator!=(&actor->LastLookActor,(AActor *)0x0);
  if ((bVar1) &&
     (pAVar3 = TObjPtr<AActor>::operator->(&actor->LastLookActor), pAVar3->tid != actor->TIDtoHate))
  {
    TObjPtr<AActor>::operator=(&actor->LastLookActor,(AActor *)0x0);
  }
  i = actor->TIDtoHate;
  pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->LastLookActor);
  FActorIterator::FActorIterator((FActorIterator *)local_48,i,pAVar3);
  uVar2 = FRandom::operator()(&pr_look3);
  local_4c = (uVar2 & 0x1f) + 7;
  while( true ) {
    pAVar3 = FActorIterator::Next((FActorIterator *)local_48);
    pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->LastLookActor);
    if (pAVar3 == pAVar4) break;
    if (pAVar3 == (AActor *)0x0) {
      if ((iterator._15_1_ & 1) != 0) break;
      iterator._15_1_ = 1;
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_50,
                 (int)pAVar3 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      if (((uVar2 != 0) && (pAVar3 != actor)) && (0 < pAVar3->health)) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_54,(int)pAVar3 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
        if (uVar2 == 0) {
          local_4c = local_4c + -1;
          if (local_4c == 0) break;
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_58,
                     (int)actor + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG))
          ;
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
          if ((uVar2 != 0) ||
             (bVar1 = P_IsVisible(actor,pAVar3,(uint)(allaround != 0),params), bVar1)) {
            pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->goal);
            if (pAVar4 != (AActor *)0x0) {
              pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->goal);
              bVar1 = TObjPtr<AActor>::operator==(&actor->target,pAVar4);
              if (bVar1) {
                actor->reactiontime = 0;
              }
            }
            TObjPtr<AActor>::operator=(&actor->target,pAVar3);
            TObjPtr<AActor>::operator=(&actor->LastLookActor,pAVar3);
            return true;
          }
        }
      }
    }
  }
  TObjPtr<AActor>::operator=(&actor->LastLookActor,pAVar3);
  bVar1 = TObjPtr<AActor>::operator==(&actor->target,(AActor *)0x0);
  if (bVar1) {
    bVar1 = TObjPtr<AActor>::operator!=(&actor->goal,(AActor *)0x0);
    if ((bVar1) && ((iterator._14_1_ & 1) != 0)) {
      (actor->target).field_0 = (actor->goal).field_0;
      return true;
    }
    bVar1 = TObjPtr<AActor>::operator!=(&actor->lastenemy,(AActor *)0x0);
    if ((bVar1) && (pAVar3 = TObjPtr<AActor>::operator->(&actor->lastenemy), 0 < pAVar3->health)) {
      pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->lastenemy);
      bVar1 = AActor::IsFriend(actor,pAVar3);
      if (!bVar1) {
        (actor->target).field_0 = (actor->lastenemy).field_0;
        TObjPtr<AActor>::operator=(&actor->lastenemy,(AActor *)0x0);
        return true;
      }
      TObjPtr<AActor>::operator=(&actor->lastenemy,(AActor *)0x0);
    }
  }
  return false;
}

Assistant:

bool P_LookForTID (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	AActor *other;
	bool reachedend = false;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	other = P_BlockmapSearch (actor, 0, LookForTIDInBlock, params);

	if (other != NULL)
	{
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}

	// The actor's TID could change because of death or because of
	// Thing_ChangeTID. If it's not what we expect, then don't use
	// it as a base for the iterator.
	if (actor->LastLookActor != NULL &&
		actor->LastLookActor->tid != actor->TIDtoHate)
	{
		actor->LastLookActor = NULL;
	}

	FActorIterator iterator (actor->TIDtoHate, actor->LastLookActor);
	int c = (pr_look3() & 31) + 7;	// Look for between 7 and 38 hatees at a time
	while ((other = iterator.Next()) != actor->LastLookActor)
	{
		if (other == NULL)
		{
			if (reachedend)
			{
				// we have cycled through the entire list at least once
				// so let's abort because even if we continue nothing can
				// be found.
				break;
			}
			reachedend = true;
			continue;
		}

		if (!(other->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (other == actor)
			continue;			// don't hate self

		if (other->health <= 0)
			continue;			// dead

		if (other->flags2 & MF2_DORMANT)
			continue;			// don't target dormant things

		if (--c == 0)
			break;

		if (!(actor->flags3 & MF3_NOSIGHTCHECK))
		{
			if (!P_IsVisible (actor, other, !!allaround, params))
				continue;			// out of sight
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after something else.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}
	actor->LastLookActor = other;
	if (actor->target == NULL)
	{
		// [RH] use goal as target
		if (actor->goal != NULL && chasegoal)
		{
			actor->target = actor->goal;
			return true;
		}
		// Use last known enemy if no hatee sighted -- killough 2/15/98:
		if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
		{
			if (!actor->IsFriend(actor->lastenemy))
			{
				actor->target = actor->lastenemy;
				actor->lastenemy = NULL;
				return true;
			}
			else
			{
				actor->lastenemy = NULL;
			}
		}
	}
	return false;
}